

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O0

_Bool wb_tree_verify(wb_tree *tree)

{
  _Bool _Var1;
  uint local_1c;
  wb_tree *pwStack_18;
  uint root_weight;
  wb_tree *tree_local;
  
  pwStack_18 = tree;
  if (tree->root == (wb_node *)0x0) {
    if (tree->count != 0) {
      fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,0x1a2,"wb_tree_verify","tree->count == 0");
      return false;
    }
  }
  else {
    if (tree->count == 0) {
      fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,0x19f,"wb_tree_verify","tree->count > 0");
      return false;
    }
    if (tree->count + 1 != (ulong)tree->root->weight) {
      fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,0x1a0,"wb_tree_verify","tree->count + 1 == tree->root->weight");
      return false;
    }
  }
  _Var1 = node_verify(tree,(wb_node *)0x0,tree->root,&local_1c);
  return _Var1;
}

Assistant:

bool
wb_tree_verify(const wb_tree* tree)
{
    if (tree->root) {
	VERIFY(tree->count > 0);
	VERIFY(tree->count + 1 == tree->root->weight);
    } else {
	VERIFY(tree->count == 0);
    }
    unsigned root_weight;
    return node_verify(tree, NULL, tree->root, &root_weight);
}